

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::Init
          (LocationRecorder *this,LocationRecorder *parent)

{
  Parser *pPVar1;
  SourceCodeInfo_Location *pSVar2;
  
  pPVar1 = parent->parser_;
  this->parser_ = pPVar1;
  pSVar2 = RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::Add
                     (&pPVar1->source_code_info_->location_);
  this->location_ = pSVar2;
  RepeatedField<int>::CopyFrom(&pSVar2->path_,&parent->location_->path_);
  SourceCodeInfo_Location::add_span(this->location_,(this->parser_->input_->current_).line);
  SourceCodeInfo_Location::add_span(this->location_,(this->parser_->input_->current_).column);
  return;
}

Assistant:

void Parser::LocationRecorder::Init(const LocationRecorder& parent) {
  parser_ = parent.parser_;
  location_ = parser_->source_code_info_->add_location();
  location_->mutable_path()->CopyFrom(parent.location_->path());

  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}